

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void doctest::detail::registerExceptionTranslatorImpl(IExceptionTranslator *et)

{
  pointer ppIVar1;
  __normal_iterator<const_doctest::detail::IExceptionTranslator_**,_std::vector<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>_>
  _Var2;
  IExceptionTranslator *in_RDI;
  IExceptionTranslator *local_18;
  
  local_18 = in_RDI;
  anon_unknown_15::getExceptionTranslators();
  ppIVar1 = anon_unknown_15::getExceptionTranslators::data.
            super__Vector_base<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  anon_unknown_15::getExceptionTranslators();
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<doctest::detail::IExceptionTranslator_const**,std::vector<doctest::detail::IExceptionTranslator_const*,std::allocator<doctest::detail::IExceptionTranslator_const*>>>,__gnu_cxx::__ops::_Iter_equals_val<doctest::detail::IExceptionTranslator_const*const>>
                    (ppIVar1,anon_unknown_15::getExceptionTranslators::data.
                             super__Vector_base<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish,&local_18);
  anon_unknown_15::getExceptionTranslators();
  if (_Var2._M_current ==
      anon_unknown_15::getExceptionTranslators::data.
      super__Vector_base<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    anon_unknown_15::getExceptionTranslators();
    if (anon_unknown_15::getExceptionTranslators::data.
        super__Vector_base<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        anon_unknown_15::getExceptionTranslators::data.
        super__Vector_base<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<doctest::detail::IExceptionTranslator_const*,std::allocator<doctest::detail::IExceptionTranslator_const*>>
      ::_M_realloc_insert<doctest::detail::IExceptionTranslator_const*const&>
                ((vector<doctest::detail::IExceptionTranslator_const*,std::allocator<doctest::detail::IExceptionTranslator_const*>>
                  *)&anon_unknown_15::getExceptionTranslators::data,
                 (iterator)
                 anon_unknown_15::getExceptionTranslators::data.
                 super__Vector_base<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,&local_18);
    }
    else {
      *anon_unknown_15::getExceptionTranslators::data.
       super__Vector_base<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>
       ._M_impl.super__Vector_impl_data._M_finish = local_18;
      anon_unknown_15::getExceptionTranslators::data.
      super__Vector_base<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           anon_unknown_15::getExceptionTranslators::data.
           super__Vector_base<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  return;
}

Assistant:

void registerExceptionTranslatorImpl(const IExceptionTranslator* et) {
        if(std::find(getExceptionTranslators().begin(), getExceptionTranslators().end(), et) ==
           getExceptionTranslators().end())
            getExceptionTranslators().push_back(et);
    }